

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

wchar_t add_option(archive_read *a,mtree_option **global,char *value,size_t len)

{
  mtree_option *__ptr;
  char *__dest;
  int *piVar1;
  
  __ptr = (mtree_option *)malloc(0x10);
  if (__ptr != (mtree_option *)0x0) {
    __dest = (char *)malloc(len + 1);
    __ptr->value = __dest;
    if (__dest != (char *)0x0) {
      memcpy(__dest,value,len);
      __dest[len] = '\0';
      __ptr->next = *global;
      *global = __ptr;
      return L'\0';
    }
    free(__ptr);
  }
  piVar1 = __errno_location();
  archive_set_error(&a->archive,*piVar1,"Can\'t allocate memory");
  return L'\xffffffe2';
}

Assistant:

static int
add_option(struct archive_read *a, struct mtree_option **global,
    const char *value, size_t len)
{
	struct mtree_option *opt;

	if ((opt = malloc(sizeof(*opt))) == NULL) {
		archive_set_error(&a->archive, errno, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	if ((opt->value = malloc(len + 1)) == NULL) {
		free(opt);
		archive_set_error(&a->archive, errno, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	memcpy(opt->value, value, len);
	opt->value[len] = '\0';
	opt->next = *global;
	*global = opt;
	return (ARCHIVE_OK);
}